

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_widgets.h
# Opt level: O0

void __thiscall dlib::tooltip::set_size(tooltip *this,unsigned_long width,unsigned_long height)

{
  rmutex *in_RDI;
  auto_mutex M;
  auto_mutex *in_stack_ffffffffffffffa0;
  undefined8 local_50;
  undefined8 local_48;
  __pthread_internal_list *in_stack_ffffffffffffffc0;
  __pthread_internal_list *in_stack_ffffffffffffffc8;
  rectangle *in_stack_ffffffffffffffd0;
  
  auto_mutex::auto_mutex(in_stack_ffffffffffffffa0,in_RDI);
  resize_rect(in_stack_ffffffffffffffd0,(unsigned_long)in_stack_ffffffffffffffc8,
              (unsigned_long)in_stack_ffffffffffffffc0);
  *(undefined8 *)((long)&(in_RDI->m).myMutex + 8) = local_50;
  *(undefined8 *)((long)&(in_RDI->m).myMutex + 0x10) = local_48;
  (in_RDI->m).myMutex.__data.__list.__prev = in_stack_ffffffffffffffc0;
  (in_RDI->m).myMutex.__data.__list.__next = in_stack_ffffffffffffffc8;
  auto_mutex::~auto_mutex((auto_mutex *)0x4532da);
  return;
}

Assistant:

void set_size (
            unsigned long width, 
            unsigned long height 
        )
        {
            auto_mutex M(m);
            rect = resize_rect(rect,width,height);
        }